

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_tags(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
         error_code *ec)

{
  bool bVar1;
  ushort uVar2;
  uint64_t uVar3;
  byte bVar4;
  uint uVar5;
  
  if ((this->source_).buffer_length_ == 0) {
    stream_source<unsigned_char>::fill_buffer(&this->source_);
  }
  if ((this->source_).buffer_length_ == 0) {
    uVar5 = 0x100;
  }
  else {
    uVar5 = (uint)*(this->source_).buffer_data_;
  }
  if (uVar5 < 0x100) {
    bVar4 = (byte)uVar5 >> 5;
    do {
      if (bVar4 != 6) {
        return;
      }
      uVar3 = get_uint64_value(this,ec);
      bVar4 = 6;
      if (ec->_M_value == 0) {
        if (uVar3 == 0x100) {
          *(byte *)&(this->other_tags_).super__Base_bitset<1UL>._M_w =
               (byte)(this->other_tags_).super__Base_bitset<1UL>._M_w | 2;
        }
        else if (uVar3 == 0x19) {
          *(byte *)&(this->other_tags_).super__Base_bitset<1UL>._M_w =
               (byte)(this->other_tags_).super__Base_bitset<1UL>._M_w | 1;
        }
        else {
          *(byte *)&(this->other_tags_).super__Base_bitset<1UL>._M_w =
               (byte)(this->other_tags_).super__Base_bitset<1UL>._M_w | 4;
          this->raw_tag_ = uVar3;
        }
        if ((this->source_).buffer_length_ == 0) {
          stream_source<unsigned_char>::fill_buffer(&this->source_);
        }
        if ((this->source_).buffer_length_ == 0) {
          uVar2 = 0x100;
        }
        else {
          uVar2 = (ushort)*(this->source_).buffer_data_;
        }
        if (0xff < uVar2) {
          std::error_code::operator=(ec,unexpected_eof);
          this->more_ = false;
          goto LAB_0027916e;
        }
        bVar4 = (byte)uVar2 >> 5;
        bVar1 = true;
      }
      else {
LAB_0027916e:
        bVar1 = false;
      }
    } while (bVar1);
  }
  else {
    std::error_code::operator=(ec,unexpected_eof);
    this->more_ = false;
  }
  return;
}

Assistant:

void read_tags(std::error_code& ec)
    {
        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(c.value);

        while (major_type == jsoncons::cbor::detail::cbor_major_type::semantic_tag)
        {
            uint64_t val = get_uint64_value(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return;
            }
            switch(val)
            {
                case 25: // stringref
                    other_tags_[stringref_tag] = true;
                    break;
                case 256: // stringref-namespace
                    other_tags_[stringref_namespace_tag] = true;
                    break;
                default:
                    other_tags_[item_tag] = true;
                    raw_tag_ = val;
                    break;
            }
            c = source_.peek();
            if (JSONCONS_UNLIKELY(c.eof))
            {
                ec = cbor_errc::unexpected_eof;
                more_ = false;
                return;
            }
            major_type = get_major_type(c.value);
        }
    }